

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O2

void __thiscall KDReports::Test::vspaceInHeader(Test *this)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  ErrorDetails details;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  QFile file;
  Report report;
  
  QString::QString((QString *)&report,":/vspaceInHeader.xml");
  QFile::QFile(&file,(QString *)&report);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
  bVar1 = (bool)QFile::open(&file,1);
  cVar2 = QTest::qVerify(bVar1,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xe4);
  if (cVar2 != '\0') {
    KDReports::Report::Report(&report,(QObject *)0x0);
    KDReports::ErrorDetails::ErrorDetails(&details);
    bVar3 = KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!report.loadFromXML(&file, &details)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0xe7);
    if (cVar2 != '\0') {
      iVar4 = KDReports::ErrorDetails::line();
      cVar2 = QTest::qCompare(iVar4,-1,"details.line()","-1",
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0xe8);
      if (cVar2 != '\0') {
        iVar4 = KDReports::ErrorDetails::column();
        cVar2 = QTest::qCompare(iVar4,-1,"details.column()","-1",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0xe9);
        if (cVar2 != '\0') {
          KDReports::ErrorDetails::driverMessage();
          QString::QString((QString *)&local_60,
                           "<vspace> not allowed in headers, footers, or table cells");
          bVar1 = QTest::qCompare((QString *)&local_48,(QString *)&local_60,
                                  "details.driverMessage()",
                                  "QString(\"<vspace> not allowed in headers, footers, or table cells\")"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0xea);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
          if (bVar1) {
            KDReports::ErrorDetails::message();
            QString::QString((QString *)&local_60,
                             "<vspace> not allowed in headers, footers, or table cells");
            QTest::qCompare((QString *)&local_48,(QString *)&local_60,"details.message()",
                            "QString(\"<vspace> not allowed in headers, footers, or table cells\")",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                            ,0xeb);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
          }
        }
      }
    }
    KDReports::ErrorDetails::~ErrorDetails(&details);
    KDReports::Report::~Report(&report);
  }
  QFile::~QFile(&file);
  return;
}

Assistant:

void vspaceInHeader()
    {
        QFile file(":/vspaceInHeader.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        KDReports::ErrorDetails details;
        QVERIFY(!report.loadFromXML(&file, &details));
        QCOMPARE(details.line(), -1);
        QCOMPARE(details.column(), -1);
        QCOMPARE(details.driverMessage(), QString("<vspace> not allowed in headers, footers, or table cells"));
        QCOMPARE(details.message(), QString("<vspace> not allowed in headers, footers, or table cells"));
    }